

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_ping(intptr_t uuid,fio_protocol_s *pr_)

{
  fio_str_info_s ch;
  fio_str_info_s data;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  fio_msg_internal_s *local_20;
  fio_msg_internal_s *m;
  fio_protocol_s *pr__local;
  intptr_t uuid_local;
  
  m = (fio_msg_internal_s *)pr_;
  pr__local = (fio_protocol_s *)uuid;
  memset(&local_38,0,0x18);
  memset(&local_50,0,0x18);
  ch.len = local_30;
  ch.capa = local_38;
  ch.data = local_28;
  data.len = local_48;
  data.capa = local_50;
  data.data = local_40;
  local_20 = fio_msg_internal_create(0,10,ch,data,'\0','\x01');
  fio_msg_internal_send_dup((intptr_t)pr__local,local_20);
  fio_msg_internal_free(local_20);
  return;
}

Assistant:

static void fio_cluster_ping(intptr_t uuid, fio_protocol_s *pr_) {
  fio_msg_internal_s *m = fio_msg_internal_create(
      0, FIO_CLUSTER_MSG_PING, (fio_str_info_s){.len = 0},
      (fio_str_info_s){.len = 0}, 0, 1);
  fio_msg_internal_send_dup(uuid, m);
  fio_msg_internal_free(m);
  (void)pr_;
}